

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpdf_encoder_cns.c
# Opt level: O2

HPDF_STATUS GBK_EUC_V_Init(HPDF_Encoder encoder)

{
  void *pvVar1;
  HPDF_STATUS HVar2;
  
  HVar2 = HPDF_CMapEncoder_InitAttr(encoder);
  if (HVar2 == 0) {
    pvVar1 = encoder->attr;
    HVar2 = HPDF_CMapEncoder_AddCMap(encoder,CMAP_ARRAY_GBK_EUC_H);
    if (HVar2 == 0) {
      HVar2 = HPDF_CMapEncoder_AddCMap(encoder,CMAP_ARRAY_GBK_EUC_V);
      if (HVar2 == 0) {
        HVar2 = GBK_EUC_AddCodeSpaceRange(encoder);
        if (HVar2 == 0) {
          HVar2 = HPDF_CMapEncoder_AddNotDefRange(encoder,(HPDF_CidRange_Rec)0x1e24001f0000);
          if (HVar2 == 0) {
            HPDF_CMapEncoder_SetUnicodeArray(encoder,CP936_UNICODE_ARRAY);
            *(code **)((long)pvVar1 + 0x40220) = GBK_EUC_IsLeadByte;
            *(code **)((long)pvVar1 + 0x40228) = GBK_EUC_IsTrialByte;
            HPDF_StrCpy((char *)((long)pvVar1 + 0x4011c),"Adobe",(char *)((long)pvVar1 + 0x4019b));
            HPDF_StrCpy((char *)((long)pvVar1 + 0x4019c),"GB1",(char *)((long)pvVar1 + 0x4021b));
            *(undefined4 *)((long)pvVar1 + 0x4021c) = 2;
            *(undefined8 *)((long)pvVar1 + 0x40230) = 0x1ffffffff;
            *(undefined8 *)((long)pvVar1 + 0x40238) = 0x63220000000a;
            *(undefined4 *)((long)pvVar1 + 0x40118) = 1;
            encoder->type = HPDF_ENCODER_TYPE_DOUBLE_BYTE;
            HVar2 = 0;
          }
          else {
            HVar2 = encoder->error->error_no;
          }
        }
      }
    }
  }
  return HVar2;
}

Assistant:

static HPDF_STATUS
GBK_EUC_V_Init  (HPDF_Encoder  encoder)
{
    HPDF_CMapEncoderAttr attr;
    HPDF_STATUS ret;

    if ((ret = HPDF_CMapEncoder_InitAttr (encoder)) != HPDF_OK)
        return ret;

    attr = (HPDF_CMapEncoderAttr)encoder->attr;

    if ((ret = HPDF_CMapEncoder_AddCMap (encoder, CMAP_ARRAY_GBK_EUC_H)) !=
            HPDF_OK)
        return ret;

    if ((ret = HPDF_CMapEncoder_AddCMap (encoder, CMAP_ARRAY_GBK_EUC_V)) !=
            HPDF_OK)
        return ret;

    if ((ret = GBK_EUC_AddCodeSpaceRange (encoder)) != HPDF_OK)
        return ret;

    if (HPDF_CMapEncoder_AddNotDefRange (encoder, GBK_EUC_NOTDEF_RANGE)
                != HPDF_OK)
        return encoder->error->error_no;

    HPDF_CMapEncoder_SetUnicodeArray (encoder, CP936_UNICODE_ARRAY);

    attr->is_lead_byte_fn = GBK_EUC_IsLeadByte;
    attr->is_trial_byte_fn = GBK_EUC_IsTrialByte;
    HPDF_StrCpy (attr->registry, "Adobe", attr->registry +
                HPDF_LIMIT_MAX_NAME_LEN);
    HPDF_StrCpy (attr->ordering, "GB1", attr->ordering +
                HPDF_LIMIT_MAX_NAME_LEN);
    attr->suppliment = 2;
    attr->uid_offset = -1;
    attr->xuid[0] = 1;
    attr->xuid[1] = 10;
    attr->xuid[2] = 25378;

    attr->writing_mode = HPDF_WMODE_VERTICAL;

    encoder->type = HPDF_ENCODER_TYPE_DOUBLE_BYTE;

    return HPDF_OK;
}